

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

RootSymbol * __thiscall
slang::ast::Compilation::getRoot(Compilation *this,bool skipDefParamResolution)

{
  flat_hash_set<string_view> *this_00;
  size_t *psVar1;
  EntryPointer psVar2;
  EntryPointer psVar3;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  *psVar4;
  pointer psVar5;
  EntryPointer psVar6;
  size_t sVar7;
  basic_string_view<char,_std::char_traits<char>_> *key;
  EntryPointer psVar8;
  pointer ppDVar9;
  char *pcVar10;
  ConstantValue *args;
  Definition *definition;
  pointer ppCVar11;
  pointer ppCVar12;
  string_view arg;
  int8_t *piVar13;
  bool bVar14;
  int iVar15;
  shared_ptr<slang::syntax::SyntaxTree> *tree;
  pointer psVar16;
  iterator iVar17;
  iterator iVar18;
  Diagnostic *pDVar19;
  ulong uVar20;
  iterator iVar21;
  InstanceSymbol *pIVar22;
  undefined4 extraout_var;
  int8_t iVar23;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var24;
  long lVar25;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  size_type extraout_RDX_11;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  *psVar26;
  pointer ppDVar27;
  ParameterDecl *param;
  ParameterDecl *pPVar28;
  EntryPointer psVar29;
  ParamOverrideNode *paramOverrideNode;
  _Head_base<0UL,_slang::parsing::ParserMetadata_*,_false> results;
  ParameterDecl *local_R12;
  pointer ppDVar30;
  long lVar31;
  SourceLocation SVar32;
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *psVar33;
  sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
  *psVar34;
  RootSymbol *pRVar35;
  Definition **__i;
  EntryPointer psVar36;
  anon_union_16_1_a8c68091_for_sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_3
  *paVar37;
  long lVar38;
  bool bVar39;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_bool>
  pVar40;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>_>_>::templated_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ConstantValue>_>,_bool>
  pVar41;
  flat_hash_map<string_view,_const_ConstantValue_*> cliOverrides;
  SmallVector<const_slang::ast::Definition_*,_5UL> topDefs;
  SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> topList;
  BindVisitor visitor;
  undefined1 local_118 [32];
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *local_f8;
  ulong local_f0;
  undefined8 local_e8;
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> local_e0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [48];
  SourceLocation local_78;
  int8_t *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  bool local_38;
  
  if (this->finalized == true) {
    pRVar35 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  }
  else {
    local_118._0_8_ =
         ska::detailv3::
         empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>>
                   ();
    results._M_head_impl = (ParserMetadata *)local_118;
    local_118._8_8_ = 0;
    local_118[0x10] = '?';
    local_118[0x11] = '\x03';
    local_118._20_4_ = 0.5;
    local_118._24_8_ = 0;
    parseParamOverrides(this,(flat_hash_map<string_view,_const_ConstantValue_*> *)
                             results._M_head_impl);
    psVar16 = (this->syntaxTrees).
              super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->syntaxTrees).
             super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar16 == psVar5) {
      bVar39 = true;
      SVar32 = (SourceLocation)0x0;
    }
    else {
      lVar25 = 0;
      SVar32 = (SourceLocation)0x0;
      do {
        results._M_head_impl =
             (((psVar16->super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->metadata)._M_t.
             super___uniq_ptr_impl<slang::parsing::ParserMetadata,_std::default_delete<slang::parsing::ParserMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::parsing::ParserMetadata_*,_std::default_delete<slang::parsing::ParserMetadata>_>
             .super__Head_base<0UL,_slang::parsing::ParserMetadata_*,_false>._M_head_impl;
        lVar25 = lVar25 + (*(long *)((long)results._M_head_impl + 0x78) -
                           *(long *)((long)results._M_head_impl + 0x70) >> 3);
        SVar32 = (SourceLocation)
                 ((long)SVar32 +
                 (*(long *)((long)results._M_head_impl + 0xa8) -
                  *(long *)((long)results._M_head_impl + 0xa0) >> 3));
        psVar16 = psVar16 + 1;
      } while (psVar16 != psVar5);
      bVar39 = lVar25 == 0;
    }
    if ((!skipDefParamResolution) && (!bVar39)) {
      resolveDefParams(this,(size_t)results._M_head_impl);
    }
    if (this->finalizing == true) {
      assert::assertFailed
                ("!finalizing",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Compilation.cpp"
                 ,0x111,"const RootSymbol &slang::ast::Compilation::getRoot(bool)");
    }
    this->finalizing = true;
    local_f8 = &local_e0;
    local_f0 = 0;
    local_e8._0_1_ = '\x05';
    local_e8._1_1_ = '\0';
    local_e8._2_2_ = 0;
    local_e8._4_4_ = 0.0;
    psVar6 = (this->definitionMap).
             super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
             .entries;
    local_78 = SVar32;
    if ((this->options).topModules.
        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        .num_elements == 0) {
      lVar25 = 0;
      do {
        lVar38 = lVar25;
        lVar25 = lVar38 + 0x28;
      } while ((&psVar6->distance_from_desired)[lVar38] < '\0');
      sVar7 = (this->definitionMap).
              super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
              .num_slots_minus_one;
      lVar25 = (long)(this->definitionMap).
                     super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                     .max_lookups;
      src = (EVP_PKEY_CTX *)(sVar7 * 5);
      if (lVar25 * 0x28 + sVar7 * 0x28 + 0x28 != lVar38 + 0x28) {
        psVar29 = (EntryPointer)(&psVar6->distance_from_desired + lVar38);
        do {
          pRVar35 = (this->root)._M_t.
                    super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                    .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
          _Var24._M_head_impl = &pRVar35->super_Scope;
          if (pRVar35 == (RootSymbol *)0x0) {
            _Var24._M_head_impl = (Scope *)0x0;
          }
          if ((Scope *)(psVar29->field_1).value.first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                       super__Head_base<1UL,_const_slang::ast::Scope_*,_false> ==
              _Var24._M_head_impl) {
            iVar17 = ska::detailv3::
                     sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ::find(&(this->globalInstantiations).
                             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            ,(basic_string_view<char,_std::char_traits<char>_> *)
                             (psVar29->field_1).value.second._M_t.
                             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                             ._M_t);
            lVar38 = (long)(this->globalInstantiations).
                           super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           .max_lookups;
            src = (EVP_PKEY_CTX *)(lVar38 * 3);
            if (iVar17.current ==
                (this->globalInstantiations).
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries +
                (this->globalInstantiations).
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .num_slots_minus_one + lVar38) {
              lVar38 = *(long *)((long)&psVar29->field_1 + 0x18);
              if (((*(char **)(lVar38 + 0x210) == (char *)0x0) ||
                  (**(char **)(lVar38 + 0x210) == '\0')) && (*(int *)(lVar38 + 0x34) == 0)) {
                bVar39 = *(long *)(lVar38 + 0x50) == 0;
                if (!bVar39) {
                  pPVar28 = *(ParameterDecl **)(lVar38 + 0x48);
                  lVar38 = *(long *)(lVar38 + 0x50) * 0x30;
                  do {
                    bVar14 = Definition::ParameterDecl::hasDefault(pPVar28);
                    if (!bVar14) {
                      iVar18 = ska::detailv3::
                               sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                               ::find((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                                       *)local_118,&pPVar28->name);
                      if (iVar18.current ==
                          (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                           *)(local_118._0_8_ + (local_118._8_8_ + (long)local_118[0x11]) * 0x20))
                      break;
                    }
                    pPVar28 = pPVar28 + 1;
                    lVar38 = lVar38 + -0x30;
                    bVar39 = lVar38 == 0;
                  } while (!bVar39);
                }
                if (bVar39) {
                  local_b8._0_8_ =
                       (psVar29->field_1).value.second._M_t.
                       super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                       ._M_t;
                  SmallVectorBase<slang::ast::Definition_const*>::
                  emplace_back<slang::ast::Definition_const*>
                            ((SmallVectorBase<slang::ast::Definition_const*> *)&local_f8,
                             (Definition **)local_b8);
                  src = extraout_RDX_00;
                  goto LAB_0021bcf9;
                }
              }
              local_b8._0_8_ =
                   (psVar29->field_1).value.second._M_t.
                   super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                   ._M_t;
              std::
              vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>::
              emplace_back<slang::ast::Definition_const*>
                        ((vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>
                          *)&this->unreferencedDefs,(Definition **)local_b8);
              src = extraout_RDX_01;
            }
          }
LAB_0021bcf9:
          do {
            psVar2 = psVar29 + 1;
            psVar29 = psVar29 + 1;
          } while (psVar2->distance_from_desired < '\0');
        } while (psVar29 != psVar6 + sVar7 + lVar25);
      }
    }
    else {
      this_00 = &(this->options).topModules;
      lVar25 = 0;
      do {
        lVar38 = lVar25;
        lVar25 = lVar38 + 0x28;
      } while ((&psVar6->distance_from_desired)[lVar38] < '\0');
      sVar7 = (this->definitionMap).
              super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
              .num_slots_minus_one;
      lVar25 = (long)(this->definitionMap).
                     super_sherwood_v3_table<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueHasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_slang::Hasher<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_ska::detailv3::KeyOrValueEquality<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>_>,_std::allocator<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::unique_ptr<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>_>_>_>_>
                     .max_lookups;
      if (lVar25 * 0x28 + sVar7 * 0x28 + 0x28 != lVar38 + 0x28) {
        psVar29 = (EntryPointer)(&psVar6->distance_from_desired + lVar38);
        do {
          pRVar35 = (this->root)._M_t.
                    super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                    .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
          _Var24._M_head_impl = &pRVar35->super_Scope;
          if (pRVar35 == (RootSymbol *)0x0) {
            _Var24._M_head_impl = (Scope *)0x0;
          }
          if ((Scope *)(psVar29->field_1).value.first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                       super__Head_base<1UL,_const_slang::ast::Scope_*,_false> ==
              _Var24._M_head_impl) {
            key = *(basic_string_view<char,_std::char_traits<char>_> **)
                   ((long)&psVar29->field_1 + 0x18);
            if ((*(int *)((long)&key[3]._M_len + 4) == 0) &&
               (iVar17 = ska::detailv3::
                         sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         ::find(&this_00->
                                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                ,key),
               iVar17.current !=
               (this->options).topModules.
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               .entries +
               (this->options).topModules.
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               .num_slots_minus_one +
               (long)(this->options).topModules.
                     super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     .max_lookups)) {
              (iVar17.current)->distance_from_desired = -1;
              psVar1 = &(this->options).topModules.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        .num_elements;
              *psVar1 = *psVar1 - 1;
              iVar23 = iVar17.current[1].distance_from_desired;
              while ('\0' < iVar23) {
                pcVar10 = iVar17.current[1].field_1.value._M_str;
                ((iVar17.current)->field_1).value._M_len = iVar17.current[1].field_1.value._M_len;
                ((iVar17.current)->field_1).value._M_str = pcVar10;
                (iVar17.current)->distance_from_desired = iVar23 + -1;
                iVar17.current[1].distance_from_desired = -1;
                psVar8 = iVar17.current + 2;
                iVar17.current = iVar17.current + 1;
                iVar23 = psVar8->distance_from_desired;
              }
              lVar38 = *(long *)((long)&psVar29->field_1 + 0x18);
              lVar31 = *(long *)(lVar38 + 0x50);
              bVar39 = lVar31 == 0;
              if (!bVar39) {
                pPVar28 = *(ParameterDecl **)(lVar38 + 0x48);
                lVar31 = lVar31 * 0x30;
                do {
                  bVar14 = Definition::ParameterDecl::hasDefault(pPVar28);
                  if (!bVar14) {
                    iVar18 = ska::detailv3::
                             sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                             ::find((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                                     *)local_118,&pPVar28->name);
                    if (iVar18.current ==
                        (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                         *)(local_118._0_8_ + (local_118._8_8_ + (long)local_118[0x11]) * 0x20))
                    break;
                  }
                  pPVar28 = pPVar28 + 1;
                  lVar31 = lVar31 + -0x30;
                  bVar39 = lVar31 == 0;
                } while (!bVar39);
              }
              if (bVar39) {
                local_b8._0_8_ =
                     (psVar29->field_1).value.second._M_t.
                     super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                     ._M_t;
                SmallVectorBase<slang::ast::Definition_const*>::
                emplace_back<slang::ast::Definition_const*>
                          ((SmallVectorBase<slang::ast::Definition_const*> *)&local_f8,
                           (Definition **)local_b8);
                goto LAB_0021ba93;
              }
              pDVar19 = Scope::addDiag(*(Scope **)
                                        ((long)(psVar29->field_1).value.second._M_t.
                                               super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                                               ._M_t + 0x28),(DiagCode)0xb000d,
                                       (SourceLocation)0xffffffffffffffff);
              Diagnostic::operator<<(pDVar19,**(string_view **)((long)&psVar29->field_1 + 0x18));
            }
            iVar17 = ska::detailv3::
                     sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     ::find(&(this->globalInstantiations).
                             super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                            ,(basic_string_view<char,_std::char_traits<char>_> *)
                             (psVar29->field_1).value.second._M_t.
                             super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                             ._M_t);
            if (iVar17.current ==
                (this->globalInstantiations).
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries +
                (this->globalInstantiations).
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .num_slots_minus_one +
                (long)(this->globalInstantiations).
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .max_lookups) {
              local_b8._0_8_ =
                   (psVar29->field_1).value.second._M_t.
                   super___uniq_ptr_impl<slang::ast::Definition,_std::default_delete<slang::ast::Definition>_>
                   ._M_t;
              std::
              vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>::
              emplace_back<slang::ast::Definition_const*>
                        ((vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>
                          *)&this->unreferencedDefs,(Definition **)local_b8);
            }
          }
LAB_0021ba93:
          do {
            psVar2 = psVar29 + 1;
            psVar29 = psVar29 + 1;
          } while (psVar2->distance_from_desired < '\0');
        } while (psVar29 != psVar6 + sVar7 + lVar25);
      }
      psVar8 = (this_00->
               super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ).entries;
      lVar25 = 0;
      do {
        lVar38 = lVar25;
        lVar25 = lVar38 + 0x18;
      } while ((&psVar8->distance_from_desired)[lVar38] < '\0');
      sVar7 = (this->options).topModules.
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .num_slots_minus_one;
      lVar25 = (long)(this->options).topModules.
                     super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     .max_lookups;
      src = (EVP_PKEY_CTX *)(sVar7 * 3);
      if (lVar25 * 0x18 + sVar7 * 0x18 + 0x18 != lVar38 + 0x18) {
        psVar36 = (EntryPointer)(&psVar8->distance_from_desired + lVar38);
        do {
          pDVar19 = Scope::addDiag(&((this->root)._M_t.
                                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                    _M_head_impl)->super_Scope,(DiagCode)0xb000d,
                                   (SourceLocation)0xffffffffffffffff);
          arg._M_len = *(size_t *)&psVar36->field_1;
          arg._M_str = *(char **)((long)&psVar36->field_1 + 8);
          Diagnostic::operator<<(pDVar19,arg);
          do {
            psVar3 = psVar36 + 1;
            psVar36 = psVar36 + 1;
          } while (psVar3->distance_from_desired < '\0');
          src = extraout_RDX;
        } while (psVar36 != psVar8 + sVar7 + lVar25);
      }
    }
    uVar20 = local_f0;
    psVar33 = local_f8;
    if (local_f0 != 0) {
      lVar38 = local_f0 * 8;
      piVar13 = &local_f8->distance_from_desired;
      lVar25 = 0x3f;
      if (local_f0 != 0) {
        for (; local_f0 >> lVar25 == 0; lVar25 = lVar25 + -1) {
        }
      }
      std::
      __introsort_loop<slang::ast::Definition_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                (local_f8,piVar13 + lVar38,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)uVar20 < 0x11) {
        std::
        __insertion_sort<slang::ast::Definition_const**,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                  (psVar33,piVar13 + lVar38);
        src = extraout_RDX_03;
      }
      else {
        paVar37 = &psVar33[5].field_1;
        std::
        __insertion_sort<slang::ast::Definition_const**,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                  (psVar33,paVar37);
        lVar25 = uVar20 * 8 + -0x80;
        do {
          std::
          __unguarded_linear_insert<slang::ast::Definition_const**,__gnu_cxx::__ops::_Val_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                    (paVar37);
          paVar37 = (anon_union_16_1_a8c68091_for_sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_3
                     *)((long)paVar37 + 8);
          lVar25 = lVar25 + -8;
          src = extraout_RDX_02;
        } while (lVar25 != 0);
      }
    }
    ppDVar27 = (this->unreferencedDefs).
               super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppDVar9 = (this->unreferencedDefs).
              super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppDVar27 != ppDVar9) {
      uVar20 = (long)ppDVar9 - (long)ppDVar27 >> 3;
      lVar25 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar25 == 0; lVar25 = lVar25 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                (ppDVar27,ppDVar9,((uint)lVar25 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppDVar9 - (long)ppDVar27 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                  (ppDVar27,ppDVar9);
        src = extraout_RDX_06;
      }
      else {
        ppDVar30 = ppDVar27 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                  (ppDVar27,ppDVar30);
        src = extraout_RDX_04;
        for (; ppDVar30 != ppDVar9; ppDVar30 = ppDVar30 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::ast::Definition_const**,std::vector<slang::ast::Definition_const*,std::allocator<slang::ast::Definition_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<slang::ast::Compilation::getRoot(bool)::__2>>
                    (ppDVar30);
          src = extraout_RDX_05;
        }
      }
    }
    if ((local_118._24_8_ != 0) && (local_f0 != 0)) {
      local_70 = &local_f8->distance_from_desired + local_f0 * 8;
      psVar33 = local_f8;
      do {
        lVar25 = (*(long **)psVar33)[1];
        local_b8._0_8_ = (Definition *)local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,lVar25,**(long **)psVar33 + lVar25);
        pVar40 = ska::detailv3::
                 sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                 ::
                 emplace<std::__cxx11::string,ska::flat_hash_map<std::__cxx11::string,slang::ast::ParamOverrideNode,slang::Hasher<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>::convertible_to_value>
                           ((sherwood_v3_table<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ast::ParamOverrideNode>>>>
                             *)&(this->paramOverrides).childNodes,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,(convertible_to_value *)local_68);
        if ((Definition *)local_b8._0_8_ != (Definition *)local_a8) {
          operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
        }
        psVar26 = (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                   *)(local_118._0_8_ + -0x20);
        lVar25 = 0x20;
        do {
          lVar25 = lVar25 + -0x20;
          psVar34 = psVar26 + 1;
          psVar26 = psVar26 + 1;
        } while (psVar34->distance_from_desired < '\0');
        src = (EVP_PKEY_CTX *)(local_118._8_8_ * 0x20);
        if (src + (long)local_118[0x11] * 0x20 + lVar25 != (EVP_PKEY_CTX *)0x0) {
          psVar34 = (sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>
                     *)(src + (long)local_118[0x11] * 0x20 + local_118._0_8_);
          do {
            pcVar10 = (psVar26->field_1).value.first._M_str;
            args = (psVar26->field_1).value.second;
            local_b8._0_8_ = (Definition *)local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,pcVar10,pcVar10 + (psVar26->field_1).value.first._M_len);
            pVar41 = ska::detailv3::
                     sherwood_v3_table<std::pair<std::__cxx11::string,slang::ConstantValue>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ConstantValue>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ConstantValue>>>>
                     ::emplace<std::__cxx11::string,slang::ConstantValue_const&>
                               ((sherwood_v3_table<std::pair<std::__cxx11::string,slang::ConstantValue>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,slang::ConstantValue>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,slang::ConstantValue>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,slang::ConstantValue>>>>
                                 *)&((pVar40.first.current.current)->field_1).value.second,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,args);
            src = pVar41._8_8_;
            if ((Definition *)local_b8._0_8_ != (Definition *)local_a8) {
              operator_delete((void *)local_b8._0_8_,local_a8._0_8_ + 1);
              src = extraout_RDX_07;
            }
            do {
              psVar4 = psVar26 + 1;
              psVar26 = psVar26 + 1;
            } while (psVar4->distance_from_desired < '\0');
          } while (psVar26 != psVar34);
        }
        psVar33 = (sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  &psVar33->field_1;
      } while (psVar33 !=
               (sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_70
              );
    }
    psVar33 = local_f8;
    local_b8._0_8_ = local_a8 + 8;
    local_b8._8_8_ = (pointer)0x0;
    local_a8._0_8_ = (pointer)0x5;
    if (local_f0 != 0) {
      lVar38 = local_f0 << 3;
      lVar25 = 0;
      do {
        definition = *(Definition **)(&psVar33->distance_from_desired + lVar25);
        if ((this->paramOverrides).childNodes.
            super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
            .num_elements == 0) {
LAB_0021c033:
          paramOverrideNode = (ParamOverrideNode *)0x0;
        }
        else {
          pcVar10 = (definition->name)._M_str;
          local_68._0_8_ = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,pcVar10,pcVar10 + (definition->name)._M_len);
          iVar21 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                   ::find(&(this->paramOverrides).childNodes.
                           super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                          ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
          if ((InstanceSymbol *)local_68._0_8_ != (InstanceSymbol *)local_58) {
            operator_delete((void *)local_68._0_8_,(ulong)(local_58._0_8_ + 1));
          }
          if (iVar21.current ==
              (this->paramOverrides).childNodes.
              super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
              .entries +
              (this->paramOverrides).childNodes.
              super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
              .num_slots_minus_one +
              (long)(this->paramOverrides).childNodes.
                    super_sherwood_v3_table<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_slang::Hasher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::ast::ParamOverrideNode>_>_>_>
                    .max_lookups) goto LAB_0021c033;
          paramOverrideNode = &((iVar21.current)->field_1).value.second;
        }
        pIVar22 = InstanceSymbol::createDefault(this,definition,paramOverrideNode);
        Scope::addMember(&((this->root)._M_t.
                           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                          super_Scope,(Symbol *)pIVar22);
        local_68._0_8_ = pIVar22;
        SmallVectorBase<slang::ast::InstanceSymbol_const*>::
        emplace_back<slang::ast::InstanceSymbol_const*>
                  ((SmallVectorBase<slang::ast::InstanceSymbol_const*> *)local_b8,
                   (InstanceSymbol **)local_68);
        lVar25 = lVar25 + 8;
        src = extraout_RDX_08;
      } while (lVar38 != lVar25);
    }
    if (((this->options).suppressUnused == false) && (local_f0 == 0)) {
      Scope::addDiag(&((this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                      super_Scope,(DiagCode)0x16000d,(SourceLocation)0xffffffffffffffff);
      src = extraout_RDX_09;
    }
    ppDVar9 = (this->unreferencedDefs).
              super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppDVar27 = (this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::Definition_*,_std::allocator<const_slang::ast::Definition_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppDVar27 != ppDVar9;
        ppDVar27 = ppDVar27 + 1) {
      pRVar35 = (this->root)._M_t.
                super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
      pIVar22 = InstanceSymbol::createInvalid(this,*ppDVar27);
      Scope::addMember(&pRVar35->super_Scope,(Symbol *)pIVar22);
      src = extraout_RDX_10;
    }
    iVar15 = SmallVectorBase<const_slang::ast::InstanceSymbol_*>::copy
                       ((SmallVectorBase<const_slang::ast::InstanceSymbol_*> *)local_b8,
                        (EVP_PKEY_CTX *)this,src);
    SVar32 = local_78;
    pRVar35 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    (pRVar35->topInstances).data_ = (pointer)CONCAT44(extraout_var,iVar15);
    (pRVar35->topInstances).size_ = extraout_RDX_11;
    ppCVar11 = (this->compilationUnits).
               super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppCVar12 = (this->compilationUnits).
               super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pRVar35 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    (pRVar35->compilationUnits).data_ = ppCVar11;
    (pRVar35->compilationUnits).size_ = (long)ppCVar12 - (long)ppCVar11 >> 3;
    this->finalized = true;
    this->finalizing = false;
    if (local_78 != (SourceLocation)0x0) {
      local_68._0_8_ = &this->seenBindDirectives;
      local_68._8_8_ = ska::detailv3::empty_default_table<slang::ast::InstanceBodySymbol_const*>();
      local_58._0_8_ = (Info *)0x0;
      local_58._8_2_ = 0x33f;
      local_58._12_4_ = 0x3f000000;
      local_58._16_8_ = (char *)0x0;
      local_58._24_8_ = SVar32;
      local_38 = false;
      Symbol::visit<slang::ast::BindVisitor&>
                (&((this->root)._M_t.
                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                  super_Symbol,(BindVisitor *)local_68);
      ska::detailv3::
      sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
      ::~sherwood_v3_table
                ((sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
                  *)(local_68 + 8));
    }
    pRVar35 = (this->root)._M_t.
              super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
              ._M_t.
              super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
              .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    if ((Definition *)local_b8._0_8_ != (Definition *)(local_a8 + 8)) {
      free((void *)local_b8._0_8_);
    }
    if (local_f8 != &local_e0) {
      free(local_f8);
    }
    this->finalizing = false;
    ska::detailv3::
    sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
    ::~sherwood_v3_table
              ((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ConstantValue_*>_>_>_>
                *)local_118);
  }
  return pRVar35;
}

Assistant:

const RootSymbol& Compilation::getRoot(bool skipDefParamResolution) {
    if (finalized)
        return *root;

    // If any top-level parameter overrides were provided, parse them now.
    flat_hash_map<string_view, const ConstantValue*> cliOverrides;
    parseParamOverrides(cliOverrides);

    // If there are defparams we need to fully resolve their values up front before
    // we start elaborating any instances.
    size_t numDefParams = 0, numBinds = 0;
    for (auto& tree : syntaxTrees) {
        auto& meta = tree->getMetadata();
        numDefParams += meta.defparams.size();
        numBinds += meta.bindDirectives.size();
    }

    if (!skipDefParamResolution && numDefParams)
        resolveDefParams(numDefParams);

    ASSERT(!finalizing);
    finalizing = true;
    auto guard = ScopeGuard([this] { finalizing = false; });

    auto isValidTop = [&](auto& definition) {
        // All parameters must have defaults.
        for (auto& param : definition.parameters) {
            if (!param.hasDefault() && cliOverrides.find(param.name) == cliOverrides.end())
                return false;
        }
        return true;
    };

    // Find top level modules that form the root of the design. Iterate the definitions
    // map before instantiating any top level modules, since that can cause changes
    // to the definition map itself.
    SmallVector<const Definition*> topDefs;
    if (options.topModules.empty()) {
        for (auto& [key, definition] : definitionMap) {
            // Ignore definitions that are not top level. Top level definitions are:
            // - Always modules
            // - Not nested
            // - Have no non-defaulted parameters
            // - Not instantiated anywhere
            if (std::get<1>(key) != root.get() ||
                globalInstantiations.find(definition->name) != globalInstantiations.end()) {
                continue;
            }

            // Library modules are never automatically instantiated in any capacity.
            if (!definition->syntaxTree || !definition->syntaxTree->isLibrary) {
                if (definition->definitionKind == DefinitionKind::Module) {
                    if (isValidTop(*definition)) {
                        // This module can be automatically instantiated.
                        topDefs.push_back(definition.get());
                        continue;
                    }
                }
            }

            // Otherwise this definition is unreferenced and not automatically instantiated.
            unreferencedDefs.push_back(definition.get());
        }
    }
    else {
        // If the list of top modules has already been provided we just need to
        // find and instantiate them.
        auto& tm = options.topModules;
        for (auto& [key, definition] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            if (definition->definitionKind == DefinitionKind::Module) {
                if (auto it = tm.find(definition->name); it != tm.end()) {
                    // Remove from the top modules set so that we know we visited it.
                    tm.erase(it);

                    // Make sure this is actually valid as a top-level module.
                    if (isValidTop(*definition)) {
                        topDefs.push_back(definition.get());
                        continue;
                    }

                    // Otherwise, issue an error because the user asked us to instantiate this.
                    definition->scope.addDiag(diag::InvalidTopModule, SourceLocation::NoLocation)
                        << definition->name;
                }
            }

            // Otherwise this definition might be unreferenced and not automatically instantiated.
            if (globalInstantiations.find(definition->name) == globalInstantiations.end())
                unreferencedDefs.push_back(definition.get());
        }

        // If any top modules were not found, issue an error.
        for (auto& name : tm)
            root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation) << name;
    }

    // Sort the list of definitions so that we get deterministic ordering of instances;
    // the order is otherwise dependent on iterating over a hash table.
    auto byName = [](auto a, auto b) { return a->name < b->name; };
    std::sort(topDefs.begin(), topDefs.end(), byName);
    std::sort(unreferencedDefs.begin(), unreferencedDefs.end(), byName);

    // If we have any cli param overrides we should apply them to
    // each top-level instance.
    if (!cliOverrides.empty()) {
        for (auto def : topDefs) {
            auto& node = paramOverrides.childNodes[std::string(def->name)];
            for (auto [name, value] : cliOverrides)
                node.overrides.emplace(std::string(name), *value);
        }
    }

    SmallVector<const InstanceSymbol*> topList;
    for (auto def : topDefs) {
        const ParamOverrideNode* paramOverrideNode = nullptr;
        if (!paramOverrides.childNodes.empty()) {
            if (auto it = paramOverrides.childNodes.find(std::string(def->name));
                it != paramOverrides.childNodes.end()) {
                paramOverrideNode = &it->second;
            }
        }

        auto& instance = InstanceSymbol::createDefault(*this, *def, paramOverrideNode);
        root->addMember(instance);
        topList.push_back(&instance);
    }

    if (!options.suppressUnused && topDefs.empty())
        root->addDiag(diag::NoTopModules, SourceLocation::NoLocation);

    // For unreferenced definitions, go through and instantiate them with all empty
    // parameter values so that we get at least some semantic checking of the contents.
    for (auto def : unreferencedDefs)
        root->addMember(InstanceSymbol::createInvalid(*this, *def));

    root->topInstances = topList.copy(*this);
    root->compilationUnits = compilationUnits;
    finalizing = false;
    finalized = true;

    // If there are any bind directives in the design, we need to opportunistically
    // traverse the hierarchy now to find them (because they can modify the hierarchy and
    // accessing other nodes / expressions might not be valid without those bound
    // instances present).
    if (numBinds) {
        BindVisitor visitor(seenBindDirectives, numBinds);
        root->visit(visitor);
    }

    return *root;
}